

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSWildcard * __thiscall
xercesc_4_0::XSObjectFactory::createXSWildcard
          (XSObjectFactory *this,SchemaAttDef *attDef,XSModel *xsModel)

{
  SchemaAttDef *pSVar1;
  XSWildcard *this_00;
  XSAnnotation *local_50;
  XSWildcard *xsWildcard;
  XSAnnotation *annot;
  XSModel *xsModel_local;
  SchemaAttDef *attDef_local;
  XSObjectFactory *this_local;
  
  pSVar1 = SchemaAttDef::getBaseAttDecl(attDef);
  if (pSVar1 == (SchemaAttDef *)0x0) {
    local_50 = getAnnotationFromModel(this,xsModel,attDef);
  }
  else {
    pSVar1 = SchemaAttDef::getBaseAttDecl(attDef);
    local_50 = getAnnotationFromModel(this,xsModel,pSVar1);
  }
  this_00 = (XSWildcard *)XMemory::operator_new(0x40,this->fMemoryManager);
  XSWildcard::XSWildcard(this_00,attDef,local_50,xsModel,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
            (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)this_00)
  ;
  return this_00;
}

Assistant:

XSWildcard*
XSObjectFactory::createXSWildcard(SchemaAttDef* const attDef,
                                  XSModel* const xsModel)
{
    XSAnnotation* annot = (attDef->getBaseAttDecl())
        ? getAnnotationFromModel(xsModel, attDef->getBaseAttDecl())
        : getAnnotationFromModel(xsModel, attDef);

    XSWildcard* xsWildcard = new (fMemoryManager) XSWildcard
    (
        attDef
        , annot
        , xsModel
        , fMemoryManager
    );
    fDeleteVector->addElement(xsWildcard);

    return xsWildcard;
}